

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::PeerManagerImpl::PackageToValidate::ToString_abi_cxx11_
          (PackageToValidate *this)

{
  long lVar1;
  size_type sVar2;
  long *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000110;
  long *in_stack_00000118;
  CTransaction *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  transaction_identifier<true> *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  string *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string *args_1;
  undefined7 in_stack_ffffffffffffff70;
  _Alloc_hider in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  val = in_RDI;
  args_1 = in_RDI;
  sVar2 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffff18);
  uVar3 = sVar2 == 2;
  inline_assertion_check<false,bool>
            ((bool *)val,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
             (char *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::front((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_ffffffffffffff20);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffff18);
  CTransaction::GetHash(in_stack_ffffffffffffff18);
  transaction_identifier<false>::ToString_abi_cxx11_
            ((transaction_identifier<false> *)in_stack_ffffffffffffff20);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::front((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_ffffffffffffff20);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffff18);
  CTransaction::GetWitnessHash(in_stack_ffffffffffffff18);
  transaction_identifier<true>::ToString_abi_cxx11_(in_stack_ffffffffffffff20);
  std::vector<long,_std::allocator<long>_>::front
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff20);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_ffffffffffffff18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffff18);
  CTransaction::GetHash(in_stack_ffffffffffffff18);
  transaction_identifier<false>::ToString_abi_cxx11_
            ((transaction_identifier<false> *)in_stack_ffffffffffffff20);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_ffffffffffffff18);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffff18);
  CTransaction::GetWitnessHash(in_stack_ffffffffffffff18);
  transaction_identifier<true>::ToString_abi_cxx11_(in_stack_ffffffffffffff20);
  std::vector<long,_std::allocator<long>_>::back
            ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff18);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff78;
  tinyformat::
  format<std::__cxx11::string,std::__cxx11::string,long,std::__cxx11::string,std::__cxx11::string,long>
            (in_stack_ffffffffffffff78._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar3,in_stack_ffffffffffffff70),args_1,in_RSI,in_stack_ffffffffffffff58,
             in_stack_00000110,in_stack_00000118);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString() const {
            Assume(m_txns.size() == 2);
            return strprintf("parent %s (wtxid=%s, sender=%d) + child %s (wtxid=%s, sender=%d)",
                             m_txns.front()->GetHash().ToString(),
                             m_txns.front()->GetWitnessHash().ToString(),
                             m_senders.front(),
                             m_txns.back()->GetHash().ToString(),
                             m_txns.back()->GetWitnessHash().ToString(),
                             m_senders.back());
        }